

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMerge.c
# Opt level: O1

void Nwk_ManCollectCircle(Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,int nFanMax)

{
  uint uVar1;
  void *pvVar2;
  long *plVar3;
  void **ppvVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  
  vNext->nSize = 0;
  if (0 < vStart->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = vStart->pArray[lVar7];
      if (0 < *(int *)((long)pvVar2 + 0x3c)) {
        lVar6 = 0;
        do {
          plVar3 = *(long **)(*(long *)((long)pvVar2 + 0x48) + lVar6 * 8);
          if (plVar3 == (long *)0x0) break;
          if (((*(uint *)(plVar3 + 4) & 7) == 3) && ((int)plVar3[5] != *(int *)(*plVar3 + 0x68))) {
            *(int *)(plVar3 + 5) = *(int *)(*plVar3 + 0x68);
            uVar1 = vNext->nCap;
            if (vNext->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (vNext->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vNext->pArray,0x80);
                }
                vNext->pArray = ppvVar4;
                iVar5 = 0x10;
              }
              else {
                iVar5 = uVar1 * 2;
                if (iVar5 <= (int)uVar1) goto LAB_0049723c;
                if (vNext->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vNext->pArray,(ulong)uVar1 << 4);
                }
                vNext->pArray = ppvVar4;
              }
              vNext->nCap = iVar5;
            }
LAB_0049723c:
            iVar5 = vNext->nSize;
            vNext->nSize = iVar5 + 1;
            vNext->pArray[iVar5] = plVar3;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < *(int *)((long)pvVar2 + 0x3c));
      }
      if (0 < *(int *)((long)pvVar2 + 0x40)) {
        lVar6 = 0;
        do {
          plVar3 = *(long **)(*(long *)((long)pvVar2 + 0x48) +
                             (*(int *)((long)pvVar2 + 0x3c) + lVar6) * 8);
          if (plVar3 == (long *)0x0) break;
          if ((((*(uint *)(plVar3 + 4) & 7) == 3) && ((int)plVar3[5] != *(int *)(*plVar3 + 0x68)))
             && (*(int *)(plVar3 + 5) = *(int *)(*plVar3 + 0x68), (int)plVar3[8] <= nFanMax)) {
            uVar1 = vNext->nCap;
            if (vNext->nSize == uVar1) {
              if ((int)uVar1 < 0x10) {
                if (vNext->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc(0x80);
                }
                else {
                  ppvVar4 = (void **)realloc(vNext->pArray,0x80);
                }
                vNext->pArray = ppvVar4;
                iVar5 = 0x10;
              }
              else {
                iVar5 = uVar1 * 2;
                if (iVar5 <= (int)uVar1) goto LAB_00497319;
                if (vNext->pArray == (void **)0x0) {
                  ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar4 = (void **)realloc(vNext->pArray,(ulong)uVar1 << 4);
                }
                vNext->pArray = ppvVar4;
              }
              vNext->nCap = iVar5;
            }
LAB_00497319:
            iVar5 = vNext->nSize;
            vNext->nSize = iVar5 + 1;
            vNext->pArray[iVar5] = plVar3;
          }
          lVar6 = lVar6 + 1;
        } while ((int)lVar6 < *(int *)((long)pvVar2 + 0x40));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vStart->nSize);
  }
  return;
}

Assistant:

void Nwk_ManCollectCircle( Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, int nFanMax )
{
    Nwk_Obj_t * pObj, * pNext;
    int i, k;
    Vec_PtrClear( vNext );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vStart, pObj, i )
    {
        Nwk_ObjForEachFanin( pObj, pNext, k )
        {
            if ( !Nwk_ObjIsNode(pNext) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pNext ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pNext );
            Vec_PtrPush( vNext, pNext );
        }
        Nwk_ObjForEachFanout( pObj, pNext, k )
        {
            if ( !Nwk_ObjIsNode(pNext) )
                continue;
            if ( Nwk_ObjIsTravIdCurrent( pNext ) )
                continue;
            Nwk_ObjSetTravIdCurrent( pNext );
            if ( Nwk_ObjFanoutNum(pNext) > nFanMax )
                continue;
            Vec_PtrPush( vNext, pNext );
        }
    }
}